

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfbs_gen_lua.cpp
# Opt level: O2

void __thiscall
flatbuffers::anon_unknown_25::LuaBfbsGenerator::EmitCodeBlock
          (LuaBfbsGenerator *this,string *code_block,string *name,string *ns,string *declaring_file)

{
  Object *pOVar1;
  String *pSVar2;
  _Base_ptr p_Var3;
  string path;
  string code;
  string file_name;
  string full_qualified_name;
  string root_file;
  string root_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string *local_d0;
  string *local_c8;
  LuaBfbsGenerator *local_c0;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pOVar1 = reflection::Schema::root_table((this->super_BaseBfbsGenerator).schema_);
  pSVar2 = reflection::Object::name(pOVar1);
  String::str_abi_cxx11_(&local_50,pSVar2);
  pOVar1 = reflection::Schema::root_table((this->super_BaseBfbsGenerator).schema_);
  pSVar2 = reflection::Object::declaration_file(pOVar1);
  String::str_abi_cxx11_(&local_70,pSVar2);
  if (ns->_M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_b0,(string *)name);
  }
  else {
    std::operator+(&local_150,ns,".");
    std::operator+(&local_b0,&local_150,name);
    std::__cxx11::string::~string((string *)&local_150);
  }
  std::operator+(&local_170,"--[[ ",&local_b0);
  std::operator+(&local_150,&local_170,"\n\n");
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::append((char *)&local_150);
  std::__cxx11::string::append((char *)&local_150);
  std::__cxx11::string::append((char *)&local_150);
  std::operator+(&local_130,"  flatc version: ",&this->flatc_version_);
  std::operator+(&local_170,&local_130,"\n");
  std::__cxx11::string::append((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::append((char *)&local_150);
  std::operator+(&local_130,"  Declared by  : ",declaring_file);
  std::operator+(&local_170,&local_130,"\n");
  std::__cxx11::string::append((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  std::operator+(&local_f0,"  Rooting type : ",&local_50);
  std::operator+(&local_110,&local_f0," (");
  std::operator+(&local_130,&local_110,&local_70);
  std::operator+(&local_170,&local_130,")\n");
  std::__cxx11::string::append((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::append((char *)&local_150);
  if ((this->requires_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_d0 = code_block;
    local_c8 = ns;
    local_c0 = this;
    local_b8 = name;
    for (p_Var3 = (this->requires_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(this->requires_)._M_t._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      std::operator+(&local_f0,"local ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 1));
      std::operator+(&local_110,&local_f0," = require(\'");
      std::operator+(&local_130,&local_110,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (p_Var3 + 2));
      std::operator+(&local_170,&local_130,"\')\n");
      std::__cxx11::string::append((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
    }
    std::__cxx11::string::append((char *)&local_150);
    name = local_b8;
    this = local_c0;
    ns = local_c8;
  }
  std::__cxx11::string::append((string *)&local_150);
  std::operator+(&local_170,"return ",name);
  std::__cxx11::string::append((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string((string *)&local_170,(string *)ns);
  if (ns->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)&local_170);
  }
  else {
    local_130._M_dataplus._M_p._0_1_ = 0x2e;
    local_110._M_dataplus._M_p._0_1_ = 0x2f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_170._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_170._M_dataplus._M_p + local_170._M_string_length),(char *)&local_130,
               (char *)&local_110);
  }
  EnsureDirExists(&local_170);
  std::operator+(&local_f0,&(this->options_).output_path,&local_170);
  std::operator+(&local_110,&local_f0,"/");
  Namer::File(&local_90,&(this->namer_).super_Namer,name,None);
  std::operator+(&local_130,&local_110,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  SaveFile((char *)CONCAT71(local_130._M_dataplus._M_p._1_7_,local_130._M_dataplus._M_p._0_1_),
           &local_150,false);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void EmitCodeBlock(const std::string &code_block, const std::string &name,
                     const std::string &ns,
                     const std::string &declaring_file) const {
    const std::string root_type = schema_->root_table()->name()->str();
    const std::string root_file =
        schema_->root_table()->declaration_file()->str();
    const std::string full_qualified_name = ns.empty() ? name : ns + "." + name;

    std::string code = "--[[ " + full_qualified_name + "\n\n";
    code +=
        "  Automatically generated by the FlatBuffers compiler, do not "
        "modify.\n";
    code += "  Or modify. I'm a message, not a cop.\n";
    code += "\n";
    code += "  flatc version: " + flatc_version_ + "\n";
    code += "\n";
    code += "  Declared by  : " + declaring_file + "\n";
    code += "  Rooting type : " + root_type + " (" + root_file + ")\n";
    code += "\n--]]\n\n";

    if (!requires_.empty()) {
      for (auto it = requires_.cbegin(); it != requires_.cend(); ++it) {
        code += "local " + it->first + " = require('" + it->second + "')\n";
      }
      code += "\n";
    }

    code += code_block;
    code += "return " + name;

    // Namespaces are '.' deliminted, so replace it with the path separator.
    std::string path = ns;

    if (ns.empty()) {
      path = ".";
    } else {
      std::replace(path.begin(), path.end(), '.', '/');
    }

    // TODO(derekbailey): figure out a save file without depending on util.h
    EnsureDirExists(path);
    const std::string file_name =
        options_.output_path + path + "/" + namer_.File(name);
    SaveFile(file_name.c_str(), code, false);
  }